

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

int scalar_decode(scalar *out,uint8_t *in,int bits)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int i;
  ulong uVar6;
  uint16_t element;
  uint uVar7;
  
  bVar3 = 0;
  iVar4 = 0;
  for (uVar6 = 0; uVar6 != 0x100; uVar6 = uVar6 + 1) {
    uVar7 = 0;
    iVar5 = 0;
    while( true ) {
      iVar2 = bits - iVar5;
      if (iVar2 == 0 || bits < iVar5) break;
      if (iVar4 == 0) {
        bVar3 = *in;
        in = in + 1;
        iVar4 = 8;
      }
      if (iVar4 <= iVar2) {
        iVar2 = iVar4;
      }
      bVar1 = *(byte *)((long)kInverseNTTRoots + (long)iVar2 + 0xff) & bVar3;
      bVar3 = bVar3 >> ((byte)iVar2 & 0x1f);
      uVar7 = uVar7 | (uint)bVar1 << ((byte)iVar5 & 0x1f);
      iVar4 = iVar4 - iVar2;
      iVar5 = iVar2 + iVar5;
    }
    if (0xd00 < (ushort)uVar7) break;
    out->c[uVar6] = (ushort)uVar7;
  }
  return (int)(0xff < uVar6);
}

Assistant:

static int scalar_decode(scalar *out, const uint8_t *in, int bits) {
  assert(bits <= (int)sizeof(*out->c) * 8 && bits != 1);

  uint8_t in_byte = 0;
  int in_byte_bits_left = 0;

  for (int i = 0; i < DEGREE; i++) {
    uint16_t element = 0;
    int element_bits_done = 0;

    while (element_bits_done < bits) {
      if (in_byte_bits_left == 0) {
        in_byte = *in;
        in++;
        in_byte_bits_left = 8;
      }

      int chunk_bits = bits - element_bits_done;
      if (chunk_bits > in_byte_bits_left) {
        chunk_bits = in_byte_bits_left;
      }

      element |= (in_byte & kMasks[chunk_bits - 1]) << element_bits_done;
      in_byte_bits_left -= chunk_bits;
      in_byte >>= chunk_bits;

      element_bits_done += chunk_bits;
    }

    // An element is only out of range in the case of invalid input, in which
    // case it is okay to leak the comparison.
    if (constant_time_declassify_int(element >= kPrime)) {
      return 0;
    }
    out->c[i] = element;
  }

  return 1;
}